

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_pages.cc
# Opt level: O2

void __thiscall
QPDF::getAllPagesInternal
          (QPDF *this,QPDFObjectHandle *cur_node,set *visited,set *seen,bool media_box)

{
  bool bVar1;
  QPDFObjGen QVar2;
  iterator key;
  iterator iVar3;
  QPDFExc *pQVar4;
  string *psVar5;
  int __val;
  bool local_112;
  allocator<char> local_111;
  string *local_110;
  string local_108;
  string local_e8;
  QPDFObjectHandle *local_c8;
  Rectangle local_c0;
  set *local_a0;
  uint local_94;
  set *local_90;
  QPDFObjectHandle kids;
  Array local_78;
  QPDFObjectHandle local_60;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  local_110 = (string *)cur_node;
  local_c8 = (QPDFObjectHandle *)this;
  local_a0 = seen;
  QVar2 = ::qpdf::BaseHandle::operator_cast_to_QPDFObjGen(&cur_node->super_BaseHandle);
  local_90 = visited;
  bVar1 = QPDFObjGen::set::add(visited,QVar2);
  if (!bVar1) {
    pQVar4 = (QPDFExc *)__cxa_allocate_exception(0x80);
    psVar5 = (string *)
             (**(code **)(**(long **)&(((((tuple<QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                           *)&(local_c8->super_BaseHandle).obj.
                                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                              ._M_ptr)->
                                        super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                        ).super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl
                                       )->file).
                                      super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2> +
                         0x18))();
    local_78.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)QPDFObjectHandle::getObjGen((QPDFObjectHandle *)local_110);
    QPDFObjGen::unparse_abi_cxx11_(&local_e8,(QPDFObjGen *)&local_78,' ');
    std::operator+(&local_108,"object ",&local_e8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c0,"Loop detected in /Pages structure (getAllPages)",
               (allocator<char> *)&kids);
    QPDFExc::QPDFExc(pQVar4,qpdf_e_pages,psVar5,&local_108,0,(string *)&local_c0);
    __cxa_throw(pQVar4,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_108,"/Pages",(allocator<char> *)&local_c0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"",(allocator<char> *)&local_78);
  bVar1 = QPDFObjectHandle::isDictionaryOfType((QPDFObjectHandle *)local_110,&local_108,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_108);
  if (!bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_108,"/Type key should be /Pages but is not; overriding",
               (allocator<char> *)&local_e8);
    QPDFObjectHandle::warnIfPossible((QPDFObjectHandle *)local_110,&local_108);
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_108,"/Type",(allocator<char> *)&local_c0);
    operator____qpdf((char *)&local_e8,0x218541);
    QPDFObjectHandle::replaceKey
              ((QPDFObjectHandle *)local_110,&local_108,(QPDFObjectHandle *)&local_e8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_e8._M_string_length);
    std::__cxx11::string::~string((string *)&local_108);
  }
  local_112 = true;
  if (!media_box) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_108,"/MediaBox",(allocator<char> *)&local_c0);
    QPDFObjectHandle::getKey((QPDFObjectHandle *)&local_e8,local_110);
    local_112 = QPDFObjectHandle::isRectangle((QPDFObjectHandle *)&local_e8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_e8._M_string_length);
    std::__cxx11::string::~string((string *)&local_108);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_108,"/Kids",(allocator<char> *)&local_e8);
  QPDFObjectHandle::getKey(&kids,local_110);
  std::__cxx11::string::~string((string *)&local_108);
  QVar2 = ::qpdf::BaseHandle::operator_cast_to_QPDFObjGen(&kids.super_BaseHandle);
  bVar1 = QPDFObjGen::set::add(local_90,QVar2);
  if (bVar1) {
    ::qpdf::Array::Array(&local_78,(shared_ptr<QPDFObject> *)&kids);
    key = ::qpdf::Array::begin(&local_78);
    iVar3 = ::qpdf::Array::end(&local_78);
    __val = 0;
    local_94 = (uint)local_112;
    for (; key._M_current != iVar3._M_current;
        key._M_current = (QPDFObjectHandle *)&((string *)key._M_current)->field_2) {
      bVar1 = QPDFObjectHandle::isDictionary(key._M_current);
      if (bVar1) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_108,"/Kids",(allocator<char> *)&local_e8);
        bVar1 = QPDFObjectHandle::hasKey(key._M_current,&local_108);
        std::__cxx11::string::~string((string *)&local_108);
        if (bVar1) {
          std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&local_40,
                     (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)key._M_current);
          getAllPagesInternal((QPDF *)local_c8,(QPDFObjectHandle *)&local_40,local_90,local_a0,
                              SUB41(local_94,0));
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
        }
        else {
          if (local_112 == false) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_108,"/MediaBox",(allocator<char> *)&local_c0);
            QPDFObjectHandle::getKey((QPDFObjectHandle *)&local_e8,(string *)key._M_current);
            bVar1 = QPDFObjectHandle::isRectangle((QPDFObjectHandle *)&local_e8);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_e8._M_string_length);
            std::__cxx11::string::~string((string *)&local_108);
            if (!bVar1) {
              std::__cxx11::to_string((string *)&local_c0,__val);
              std::operator+(&local_e8,"kid ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_c0);
              std::operator+(&local_108,&local_e8,
                             " (from 0) MediaBox is undefined; setting to letter / ANSI A");
              QPDFObjectHandle::warnIfPossible(key._M_current,&local_108);
              std::__cxx11::string::~string((string *)&local_108);
              std::__cxx11::string::~string((string *)&local_e8);
              std::__cxx11::string::~string((string *)&local_c0);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_108,"/MediaBox",&local_111);
              local_e8._M_dataplus._M_p = (pointer)0x0;
              local_e8._M_string_length = 0;
              local_e8.field_2._M_allocated_capacity = 0x4083200000000000;
              local_e8.field_2._8_8_ = 0x4088c00000000000;
              QPDFObjectHandle::newArray(&local_c0);
              QPDFObjectHandle::replaceKey(key._M_current,&local_108,(QPDFObjectHandle *)&local_c0);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_c0.lly);
              std::__cxx11::string::~string((string *)&local_108);
            }
          }
          bVar1 = QPDFObjectHandle::isIndirect(key._M_current);
          if (bVar1) {
            QVar2 = ::qpdf::BaseHandle::operator_cast_to_QPDFObjGen
                              (&(key._M_current)->super_BaseHandle);
            bVar1 = QPDFObjGen::set::add(local_a0,QVar2);
            if (!bVar1) {
              std::__cxx11::to_string((string *)&local_c0,__val);
              std::operator+(&local_e8,"kid ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_c0);
              std::operator+(&local_108,&local_e8,
                             " (from 0) appears more than once in the pages tree; creating a new page object as a copy"
                            );
              QPDFObjectHandle::warnIfPossible((QPDFObjectHandle *)local_110,&local_108);
              std::__cxx11::string::~string((string *)&local_108);
              std::__cxx11::string::~string((string *)&local_e8);
              std::__cxx11::string::~string((string *)&local_c0);
              std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                        ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&local_e8,
                         (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)key._M_current);
              QPDFObjectHandle::shallowCopy(&local_60);
              makeIndirectObject((QPDF *)&local_108,local_c8);
              std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
                        ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)key._M_current,
                         (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&local_108);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_108._M_string_length);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        (&local_60.super_BaseHandle.obj.
                          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_e8._M_string_length);
              QVar2 = ::qpdf::BaseHandle::operator_cast_to_QPDFObjGen
                                (&(key._M_current)->super_BaseHandle);
              QPDFObjGen::set::add(local_a0,QVar2);
            }
          }
          else {
            std::__cxx11::to_string((string *)&local_c0,__val);
            std::operator+(&local_e8,"kid ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_c0);
            std::operator+(&local_108,&local_e8," (from 0) is direct; converting to indirect");
            QPDFObjectHandle::warnIfPossible((QPDFObjectHandle *)local_110,&local_108);
            std::__cxx11::string::~string((string *)&local_108);
            std::__cxx11::string::~string((string *)&local_e8);
            std::__cxx11::string::~string((string *)&local_c0);
            std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                      (&local_50,
                       (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)key._M_current);
            makeIndirectObject((QPDF *)&local_108,local_c8);
            std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
                      ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)key._M_current,
                       (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&local_108);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_108._M_string_length);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
          }
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_108,"/Page",(allocator<char> *)&local_c0);
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"",&local_111);
          bVar1 = QPDFObjectHandle::isDictionaryOfType(key._M_current,&local_108,&local_e8);
          std::__cxx11::string::~string((string *)&local_e8);
          std::__cxx11::string::~string((string *)&local_108);
          if (!bVar1) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_108,"/Type key should be /Page but is not; overriding",
                       (allocator<char> *)&local_e8);
            QPDFObjectHandle::warnIfPossible(key._M_current,&local_108);
            std::__cxx11::string::~string((string *)&local_108);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_108,"/Type",(allocator<char> *)&local_c0);
            operator____qpdf((char *)&local_e8,0x22a366);
            QPDFObjectHandle::replaceKey(key._M_current,&local_108,(QPDFObjectHandle *)&local_e8);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_e8._M_string_length);
            std::__cxx11::string::~string((string *)&local_108);
          }
          std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::push_back
                    (&((((tuple<QPDF::Members_*,_std::default_delete<QPDF::Members>_> *)
                        &(local_c8->super_BaseHandle).obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                       super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>)
                       .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->all_pages,
                     key._M_current);
        }
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_108,"Pages tree includes non-dictionary object; ignoring",
                   (allocator<char> *)&local_e8);
        QPDFObjectHandle::warnIfPossible(key._M_current,&local_108);
        std::__cxx11::string::~string((string *)&local_108);
        ((((tuple<QPDF::Members_*,_std::default_delete<QPDF::Members>_> *)
          &(local_c8->super_BaseHandle).obj.
           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
         super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>).
         super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->invalid_page_found = true;
      }
      __val = __val + 1;
    }
    ::qpdf::Array::~Array(&local_78);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&kids.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    return;
  }
  pQVar4 = (QPDFExc *)__cxa_allocate_exception(0x80);
  psVar5 = (string *)
           (**(code **)(**(long **)&(((((tuple<QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                         *)&(local_c8->super_BaseHandle).obj.
                                            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_ptr)->
                                      super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                      ).super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)
                                    ->file).
                                    super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2> +
                       0x18))();
  local_78.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)QPDFObjectHandle::getObjGen((QPDFObjectHandle *)local_110);
  QPDFObjGen::unparse_abi_cxx11_(&local_e8,(QPDFObjGen *)&local_78,' ');
  std::operator+(&local_108,"object ",&local_e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"Loop detected in /Pages structure (getAllPages)",&local_111);
  QPDFExc::QPDFExc(pQVar4,qpdf_e_pages,psVar5,&local_108,0,(string *)&local_c0);
  __cxa_throw(pQVar4,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
}

Assistant:

void
QPDF::getAllPagesInternal(
    QPDFObjectHandle cur_node, QPDFObjGen::set& visited, QPDFObjGen::set& seen, bool media_box)
{
    if (!visited.add(cur_node)) {
        throw QPDFExc(
            qpdf_e_pages,
            m->file->getName(),
            "object " + cur_node.getObjGen().unparse(' '),
            0,
            "Loop detected in /Pages structure (getAllPages)");
    }
    if (!cur_node.isDictionaryOfType("/Pages")) {
        cur_node.warnIfPossible("/Type key should be /Pages but is not; overriding");
        cur_node.replaceKey("/Type", "/Pages"_qpdf);
    }
    if (!media_box) {
        media_box = cur_node.getKey("/MediaBox").isRectangle();
        QTC::TC("qpdf", "QPDF inherit mediabox", media_box ? 0 : 1);
    }
    auto kids = cur_node.getKey("/Kids");
    if (!visited.add(kids)) {
        throw QPDFExc(
            qpdf_e_pages,
            m->file->getName(),
            "object " + cur_node.getObjGen().unparse(' '),
            0,
            "Loop detected in /Pages structure (getAllPages)");
    }
    int i = -1;
    for (auto& kid: kids.as_array()) {
        ++i;
        if (!kid.isDictionary()) {
            kid.warnIfPossible("Pages tree includes non-dictionary object; ignoring");
            m->invalid_page_found = true;
            continue;
        }
        if (kid.hasKey("/Kids")) {
            getAllPagesInternal(kid, visited, seen, media_box);
        } else {
            if (!media_box && !kid.getKey("/MediaBox").isRectangle()) {
                QTC::TC("qpdf", "QPDF missing mediabox");
                kid.warnIfPossible(
                    "kid " + std::to_string(i) +
                    " (from 0) MediaBox is undefined; setting to letter / ANSI A");
                kid.replaceKey(
                    "/MediaBox",
                    QPDFObjectHandle::newArray(QPDFObjectHandle::Rectangle(0, 0, 612, 792)));
            }
            if (!kid.isIndirect()) {
                QTC::TC("qpdf", "QPDF handle direct page object");
                cur_node.warnIfPossible(
                    "kid " + std::to_string(i) + " (from 0) is direct; converting to indirect");
                kid = makeIndirectObject(kid);
            } else if (!seen.add(kid)) {
                // Make a copy of the page. This does the same as shallowCopyPage in
                // QPDFPageObjectHelper.
                QTC::TC("qpdf", "QPDF resolve duplicated page object");
                cur_node.warnIfPossible(
                    "kid " + std::to_string(i) +
                    " (from 0) appears more than once in the pages tree;"
                    " creating a new page object as a copy");
                kid = makeIndirectObject(QPDFObjectHandle(kid).shallowCopy());
                seen.add(kid);
            }
            if (!kid.isDictionaryOfType("/Page")) {
                kid.warnIfPossible("/Type key should be /Page but is not; overriding");
                kid.replaceKey("/Type", "/Page"_qpdf);
            }
            m->all_pages.push_back(kid);
        }
    }
}